

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O2

int messagereceiver_close(MESSAGE_RECEIVER_HANDLE message_receiver)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (message_receiver == (MESSAGE_RECEIVER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x18b;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                ,"messagereceiver_close",0x18a,1,"NULL message_receiver");
    }
  }
  else {
    iVar3 = 0;
    if ((message_receiver->message_receiver_state & ~MESSAGE_RECEIVER_STATE_IDLE) ==
        MESSAGE_RECEIVER_STATE_OPENING) {
      set_message_receiver_state(message_receiver,MESSAGE_RECEIVER_STATE_CLOSING);
      iVar3 = 0;
      iVar1 = link_detach(message_receiver->link,true,(char *)0x0,(char *)0x0,(AMQP_VALUE)0x0);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_receiver.c"
                    ,"messagereceiver_close",0x196,1,"link detach failed");
        }
        set_message_receiver_state(message_receiver,MESSAGE_RECEIVER_STATE_ERROR);
        iVar3 = 0x197;
      }
    }
  }
  return iVar3;
}

Assistant:

int messagereceiver_close(MESSAGE_RECEIVER_HANDLE message_receiver)
{
    int result;

    if (message_receiver == NULL)
    {
        LogError("NULL message_receiver");
        result = MU_FAILURE;
    }
    else
    {
        if ((message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPENING) ||
            (message_receiver->message_receiver_state == MESSAGE_RECEIVER_STATE_OPEN))
        {
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_CLOSING);

            if (link_detach(message_receiver->link, true, NULL, NULL, NULL) != 0)
            {
                LogError("link detach failed");
                result = MU_FAILURE;
                set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
            }
            else
            {
                result = 0;
            }
        }
        else
        {
            result = 0;
        }
    }

    return result;
}